

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O3

void __thiscall
Ptex::v2_2::PtexReader::readMetaDataBlock
          (PtexReader *this,MetaData *metadata,FilePos pos,int zipsize,int memsize,
          size_t *metaDataMemUsed)

{
  byte *key;
  byte *pbVar1;
  byte bVar2;
  byte datatype;
  uint datasize;
  MetaData *this_00;
  int zipsize_00;
  bool bVar3;
  byte *pbVar4;
  Entry *pEVar5;
  char *__dest;
  byte *pbVar6;
  ulong __n;
  byte abStack_58 [8];
  MetaData *local_50;
  byte *local_48;
  byte *local_40;
  int local_34;
  
  local_40 = (byte *)CONCAT44(local_40._4_4_,zipsize);
  seek(this,pos);
  if (memsize < 0x4001) {
    pbVar4 = abStack_58 + -((long)memsize + 0xfU & 0xfffffffffffffff0);
    pbVar6 = pbVar4;
  }
  else {
    pbVar4 = (byte *)operator_new__((ulong)(uint)memsize);
    pbVar6 = abStack_58;
  }
  zipsize_00 = (int)local_40;
  local_48 = pbVar4;
  local_34 = memsize;
  pbVar6[-8] = 0x65;
  pbVar6[-7] = 0xf7;
  pbVar6[-6] = 0x10;
  pbVar6[-5] = 0;
  pbVar6[-4] = 0;
  pbVar6[-3] = 0;
  pbVar6[-2] = 0;
  pbVar6[-1] = 0;
  bVar3 = readZipBlock(this,pbVar4,zipsize_00,memsize);
  if (bVar3) {
    if (local_34 < 1) {
      return;
    }
    local_40 = local_48 + memsize;
    pbVar4 = local_48;
    local_50 = metadata;
    do {
      this_00 = local_50;
      key = pbVar4 + 1;
      bVar2 = *pbVar4;
      pbVar1 = pbVar4 + bVar2;
      *pbVar1 = 0;
      datatype = pbVar1[1];
      datasize = *(uint *)(pbVar1 + 2);
      __n = (ulong)datasize;
      pbVar4 = pbVar4 + __n + bVar2 + 6;
      pbVar6[-8] = 0xcb;
      pbVar6[-7] = 0xf7;
      pbVar6[-6] = 0x10;
      pbVar6[-5] = 0;
      pbVar6[-4] = 0;
      pbVar6[-3] = 0;
      pbVar6[-2] = 0;
      pbVar6[-1] = 0;
      pEVar5 = MetaData::newEntry(this_00,bVar2 - 1,(char *)key,datatype,datasize,metaDataMemUsed);
      pbVar6[-8] = 0xd6;
      pbVar6[-7] = 0xf7;
      pbVar6[-6] = 0x10;
      pbVar6[-5] = 0;
      pbVar6[-4] = 0;
      pbVar6[-3] = 0;
      pbVar6[-2] = 0;
      pbVar6[-1] = 0;
      __dest = (char *)operator_new__(__n);
      pEVar5->data = __dest;
      pbVar6[-8] = 0xe8;
      pbVar6[-7] = 0xf7;
      pbVar6[-6] = 0x10;
      pbVar6[-5] = 0;
      pbVar6[-4] = 0;
      pbVar6[-3] = 0;
      pbVar6[-2] = 0;
      pbVar6[-1] = 0;
      memcpy(__dest,pbVar1 + 6,__n);
      *metaDataMemUsed = *metaDataMemUsed + __n;
    } while (pbVar4 < local_40);
  }
  pbVar4 = local_48;
  if (0x4000 < local_34) {
    pbVar6[-8] = 3;
    pbVar6[-7] = 0xf8;
    pbVar6[-6] = 0x10;
    pbVar6[-5] = 0;
    pbVar6[-4] = 0;
    pbVar6[-3] = 0;
    pbVar6[-2] = 0;
    pbVar6[-1] = 0;
    operator_delete__(pbVar4);
  }
  return;
}

Assistant:

void PtexReader::readMetaDataBlock(MetaData* metadata, FilePos pos, int zipsize, int memsize, size_t& metaDataMemUsed)
{
    seek(pos);
    // read from file
    bool useNew = memsize > AllocaMax;
    char* buff = useNew ? new char[memsize] : (char*)alloca(memsize);

    if (readZipBlock(buff, zipsize, memsize)) {
        // unpack data entries
        char* ptr = buff;
        char* end = ptr + memsize;
        while (ptr < end) {
            uint8_t keysize = *ptr++;
            char* key = (char*)ptr; ptr += keysize;
            key[keysize-1] = '\0';
            uint8_t datatypeval = *ptr++;
            uint32_t datasize; memcpy(&datasize, ptr, sizeof(datasize));
            ptr += sizeof(datasize);
            char* data = ptr; ptr += datasize;
            metadata->addEntry((uint8_t)(keysize-1), key, datatypeval, datasize, data, metaDataMemUsed);
        }
    }
    if (useNew) delete [] buff;
}